

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O1

StatusOr<long> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::ValidateNumberConversion<long,double>
          (StatusOr<long> *__return_storage_ptr__,_anonymous_namespace_ *this,long after,
          double before)

{
  StringPiece error_message;
  int iVar1;
  double dVar2;
  StringPiece error_message_00;
  string local_90;
  Status local_70;
  Status local_48;
  
  if (((double)(long)this == before) && (!NAN((double)(long)this) && !NAN(before))) {
    dVar2 = before;
    if (before != 0.0) {
      dVar2 = *(double *)(&DAT_0035f400 + (ulong)(0.0 < before) * 8);
    }
    iVar1 = ((0 < (long)this) - 1) + (uint)(0 < (long)this);
    if (this == (_anonymous_namespace_ *)0x0) {
      iVar1 = 0;
    }
    if ((dVar2 == (double)iVar1) && (!NAN(dVar2) && !NAN((double)iVar1))) {
      Status::Status(&__return_storage_ptr__->status_);
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      __return_storage_ptr__->value_ = (long)this;
      return __return_storage_ptr__;
    }
  }
  DoubleAsString_abi_cxx11_(&local_90,(converter *)this,before);
  error_message.length_ = local_90._M_string_length;
  error_message.ptr_ = local_90._M_dataplus._M_p;
  if ((long)local_90._M_string_length < 0) {
    StringPiece::LogFatalSizeTooBig(local_90._M_string_length,"size_t to int conversion");
  }
  Status::Status(&local_48,INVALID_ARGUMENT,error_message);
  Status::Status(&__return_storage_ptr__->status_);
  if (local_48.error_code_ == OK) {
    error_message_00.length_ = 0x23;
    error_message_00.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_00);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.error_message_._M_dataplus._M_p != &local_70.error_message_.field_2) {
      operator_delete(local_70.error_message_._M_dataplus._M_p);
    }
  }
  else {
    Status::operator=(&__return_storage_ptr__->status_,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.error_message_._M_dataplus._M_p != &local_48.error_message_.field_2) {
    operator_delete(local_48.error_message_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}